

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O1

RecyclerWeakReference<Js::DynamicType> * __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::DynamicType,_Js::DynamicType_*,_DefaultComparer<const_Js::DynamicType_*>,_true>
::Insert(WeaklyReferencedKeyDictionary<Js::DynamicType,_Js::DynamicType_*,_DefaultComparer<const_Js::DynamicType_*>,_true>
         *this,DynamicType *key,DynamicType *value,bool add,bool checkForExisting)

{
  uint uVar1;
  WeakRefDictionaryEntry<Js::DynamicType,_Memory::WriteBarrierPtr<Js::DynamicType>_> *pWVar2;
  DynamicType *pDVar3;
  Recycler *recycler;
  hash_t bucket;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  DynamicType *pDVar6;
  undefined4 extraout_var_00;
  RecyclerWeakReferenceBase *weakRef;
  RecyclerWeakReference<Js::DynamicType> *pRVar7;
  WriteBarrierPtr<Js::DynamicType> *addr;
  DynamicType *pDVar8;
  uint key_00;
  byte bVar9;
  
  if ((this->buckets).ptr == (int *)0x0) {
    Initialize(this,0);
  }
  key_00 = (uint)((ulong)key >> 3) | 1;
  bucket = PrimePolicy::ModPrime(key_00,this->size,this->modFunctionIndex);
  pRVar7 = (RecyclerWeakReference<Js::DynamicType> *)CONCAT44(extraout_var,bucket);
  if (!checkForExisting) goto LAB_00dde73d;
  if ((this->buckets).ptr == (int *)0x0) {
LAB_00dde6c9:
    iVar5 = -1;
  }
  else {
    Memory::Recycler::IsSweeping(this->recycler);
    uVar1 = (this->buckets).ptr[bucket];
    pDVar6 = (DynamicType *)(ulong)uVar1;
    pDVar8 = value;
    if ((int)uVar1 < 0) {
      pRVar7 = (RecyclerWeakReference<Js::DynamicType> *)CONCAT71((uint7)(uint3)(uVar1 >> 8),1);
    }
    else {
      iVar5 = -1;
      do {
        pWVar2 = (this->entries).ptr;
        if (pWVar2[(ulong)pDVar6 & 0xffffffff].hash == key_00) {
          pDVar3 = (DynamicType *)
                   ((pWVar2[(ulong)pDVar6 & 0xffffffff].key.ptr)->super_RecyclerWeakReferenceBase).
                   strongRef;
          if (pDVar3 == (DynamicType *)0x0) {
            iVar4 = RemoveEntry(this,(int)pDVar6,iVar5,bucket);
            pDVar6 = (DynamicType *)CONCAT44(extraout_var_00,iVar4);
            bVar9 = 3;
          }
          else {
            bVar9 = pDVar3 == key;
            if ((bool)bVar9) {
              pDVar8 = pDVar6;
            }
            pDVar8 = (DynamicType *)((ulong)pDVar8 & 0xffffffff);
          }
          if (bVar9 == 0) goto LAB_00dde6a1;
          if (bVar9 != 3) goto LAB_00dde6bb;
        }
        else {
LAB_00dde6a1:
          iVar5 = (int)pDVar6;
          pDVar6 = (DynamicType *)(ulong)(uint)(this->entries).ptr[iVar5].next;
        }
      } while (-1 < (int)pDVar6);
      bVar9 = 0;
LAB_00dde6bb:
      pRVar7 = (RecyclerWeakReference<Js::DynamicType> *)
               CONCAT71((int7)((ulong)pDVar6 >> 8),(bVar9 & 1) == 0);
    }
    iVar5 = (int)pDVar8;
    if ((char)pRVar7 != '\0') goto LAB_00dde6c9;
  }
  if (iVar5 != -1) {
    if (add) {
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    addr = &(this->entries).ptr[iVar5].value;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = value;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this->version = this->version + 1;
    pRVar7 = (this->entries).ptr[iVar5].key.ptr;
  }
  if (iVar5 != -1) {
    return pRVar7;
  }
LAB_00dde73d:
  recycler = this->recycler;
  weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                      (&recycler->weakReferenceMap,(char *)key,recycler);
  if (weakRef->typeInfo == (Type)0x0) {
    weakRef->typeInfo = (Type)&Js::DynamicType::typeinfo;
    Memory::Recycler::TrackAllocWeakRef(recycler,weakRef);
  }
  pRVar7 = Insert(this,(RecyclerWeakReference<Js::DynamicType> *)weakRef,value,key_00,bucket);
  return pRVar7;
}

Assistant:

const RecyclerWeakReference<TKey>* Insert(TKey* key, TValue value, bool add, bool checkForExisting = true)
        {
            if (buckets == nullptr) Initialize(0);

            hash_t hash = GetHashCode(key);
            uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);

            if (checkForExisting)
            {
                int previous = -1;
                int i = FindEntry(key, hash, bucket, previous);

                if (i != -1)
                {
                    if (add)
                    {
                        Js::Throw::FatalInternalError();
                    }

                    entries[i].value = value;
                    version++;
                    return entries[i].key;
                }
            }

            // We know we need to insert- so first try creating the weak reference, before adding it to
            // the dictionary. If we OOM here, we still leave the dictionary as we found it.
            const RecyclerWeakReference<TKey>* weakRef = recycler->CreateWeakReferenceHandle<TKey>(key);

            return Insert(weakRef, value, hash, bucket);
        }